

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialize_combined<_IO_FILE*>
               (IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,TreesIndexer *indexer,
               char *optional_metadata,size_t size_optional_metadata,_IO_FILE **out)

{
  pointer pSVar1;
  size_t sVar2;
  long __off;
  runtime_error *this;
  size_t sVar3;
  SingleTreeIndex *node;
  pointer node_00;
  uint8_t model_type;
  uint8_t ending_type;
  SignalSwitcher ss;
  size_t jump_ahead;
  undefined1 local_72;
  undefined1 local_71;
  size_t local_70;
  size_t local_68;
  SignalSwitcher local_60;
  char *local_50;
  long local_48;
  IsoForest *local_40;
  undefined8 local_38;
  
  local_68 = size_optional_metadata;
  local_50 = optional_metadata;
  SignalSwitcher::SignalSwitcher(&local_60);
  local_48 = ftell((FILE *)*out);
  add_setup_info<_IO_FILE*>(out,false);
  local_72 = 4;
  write_bytes<unsigned_char>(&local_72,1,out);
  if (model == (IsoForest *)0x0) {
    if (model_ext == (ExtIsoForest *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (size_optional_metadata == 0) {
      if (imputer == (Imputer *)0x0) {
        if (indexer == (TreesIndexer *)0x0) {
          local_72 = 2;
        }
        else {
          local_72 = 0xe;
        }
      }
      else if (indexer == (TreesIndexer *)0x0) {
        local_72 = 5;
      }
      else {
        local_72 = 0xf;
      }
    }
    else if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        local_72 = 7;
      }
      else {
        local_72 = 0x11;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      local_72 = 9;
    }
    else {
      local_72 = 0x13;
    }
  }
  else if (size_optional_metadata == 0) {
    if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        local_72 = 1;
      }
      else {
        local_72 = 0xc;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      local_72 = 4;
    }
    else {
      local_72 = 0xd;
    }
  }
  else if (imputer == (Imputer *)0x0) {
    if (indexer == (TreesIndexer *)0x0) {
      local_72 = 6;
    }
    else {
      local_72 = 0x10;
    }
  }
  else if (indexer == (TreesIndexer *)0x0) {
    local_72 = 8;
  }
  else {
    local_72 = 0x12;
  }
  write_bytes<unsigned_char>(&local_72,1,out);
  local_40 = model;
  if (model == (IsoForest *)0x0) {
    local_70 = get_size_model(model_ext);
  }
  else {
    local_70 = get_size_model(model);
  }
  write_bytes<unsigned_long>(&local_70,1,out);
  if (imputer == (Imputer *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = get_size_model(imputer);
  }
  write_bytes<unsigned_long>(&local_70,1,out);
  if (indexer == (TreesIndexer *)0x0) {
    sVar3 = 0;
  }
  else {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = 8;
    for (node_00 = (indexer->indices).
                   super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                   super__Vector_impl_data._M_start; node_00 != pSVar1; node_00 = node_00 + 1) {
      sVar2 = get_size_node(node_00);
      sVar3 = sVar3 + sVar2;
    }
  }
  local_70 = sVar3;
  write_bytes<unsigned_long>(&local_70,1,out);
  write_bytes<unsigned_long>(&local_68,1,out);
  check_interrupt_switch(&local_60);
  if (local_40 == (IsoForest *)0x0) {
    serialize_model<_IO_FILE*>(model_ext,out);
  }
  else {
    serialize_model<_IO_FILE*>(local_40,out);
  }
  if (imputer != (Imputer *)0x0) {
    serialize_model<_IO_FILE*>(imputer,out);
  }
  if (indexer != (TreesIndexer *)0x0) {
    serialize_model<_IO_FILE*>(indexer,out);
  }
  if (local_68 != 0) {
    write_bytes<char>(local_50,local_68,out);
  }
  check_interrupt_switch(&local_60);
  local_71 = 0;
  write_bytes<unsigned_char>(&local_71,1,out);
  local_38 = 0;
  write_bytes<unsigned_long>(&local_38,1,out);
  __off = ftell((FILE *)*out);
  fseek((FILE *)*out,local_48,0);
  write_bytes<unsigned_char>(watermark,0xd,out);
  fseek((FILE *)*out,__off,0);
  SignalSwitcher::~SignalSwitcher(&local_60);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    otype &out
)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);

    add_setup_info(out, false);
    uint8_t model_type = AllObjectsCombined;
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    if (model != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelNext;
                else
                    model_type = HasSingleVarModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasSingleVarModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }

    }

    else if (model_ext != NULL)
    {

        if (!size_optional_metadata)
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelNext;
                else
                    model_type = HasExtModelPlusIndexerNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerNext;
            }
        }

        else
        {
            if (imputer == NULL) {
                if (indexer == NULL)
                    model_type = HasExtModelPlusMetadataNext;
                else
                    model_type = HasExtModelPlusIndexerPlusMetadataNext;
            }
            else {
                if (indexer == NULL)
                    model_type = HasExtModelPlusImputerPlusMetadataNext;
                else
                    model_type = HasExtModelPlusImputerPlusIndexerPlusMetadataNext;
            }
        }
    }

    else {
        throw std::runtime_error("Must pass one of 'model' or 'model_ext'.\n");
    }

    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);

    size_t size_model;
    if (model != NULL)
        size_model = get_size_model(*model);
    else
        size_model = get_size_model(*model_ext);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (imputer != NULL)
        size_model = get_size_model(*imputer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    if (indexer != NULL)
        size_model = get_size_model(*indexer);
    else
        size_model = 0;
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);

    write_bytes<size_t>((void*)&size_optional_metadata, (size_t)1, out);


    check_interrupt_switch(ss);

    if (model != NULL)
        serialize_model(*model, out);
    else
        serialize_model(*model_ext, out);

    if (imputer != NULL)
        serialize_model(*imputer, out);

    if (indexer != NULL)
        serialize_model(*indexer, out);

    if (size_optional_metadata)
        write_bytes<char>((void*)optional_metadata, size_optional_metadata, out);

    check_interrupt_switch(ss);

    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}